

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  _List_node_base *p_Var2;
  cmFileLockPool *pcVar3;
  
  pcVar3 = this;
  while (pcVar3 = (cmFileLockPool *)
                  (pcVar3->FunctionScopes).
                  super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next, pcVar3 != this) {
    bVar1 = ScopePool::IsAlreadyLocked
                      ((ScopePool *)
                       (pcVar3->FunctionScopes).
                       super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                       ._M_impl._M_node._M_size,filename);
    if (bVar1) {
      return true;
    }
  }
  p_Var2 = (_List_node_base *)&this->FileScopes;
  do {
    p_Var2 = (((_List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->FileScopes) {
      bVar1 = ScopePool::IsAlreadyLocked(&this->ProcessScope,filename);
      return bVar1;
    }
    bVar1 = ScopePool::IsAlreadyLocked((ScopePool *)p_Var2[1]._M_next,filename);
  } while (!bVar1);
  return true;
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (CIt i = this->FunctionScopes.begin();
      i != this->FunctionScopes.end(); ++i)
    {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result)
      {
      return true;
      }
    }

  for (CIt i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i)
    {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result)
      {
      return true;
      }
    }

  return this->ProcessScope.IsAlreadyLocked(filename);
}